

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool Corrade::Utility::Path::make(StringView path)

{
  StringView path_00;
  StringView path_01;
  StringView path_02;
  StringView value;
  StringView value_00;
  StringView a;
  StringView filename;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__path;
  int *piVar4;
  Debug *pDVar5;
  undefined8 in_RCX;
  undefined7 uVar7;
  size_t sVar6;
  char *in_RSI;
  String *in_RDI;
  StringView b;
  StringView view;
  Error err;
  String pathNullTerminated;
  Error local_68;
  String local_40;
  StringView local_28;
  
  uVar7 = (undefined7)((ulong)in_RCX >> 8);
  if (((ulong)in_RSI & 0x3fffffffffffffff) == 0 || in_RDI == (String *)0x0) {
    return true;
  }
  bVar1 = Containers::BasicStringView<const_char>::hasSuffix
                    ((BasicStringView<const_char> *)&stack0xffffffffffffff88,'/');
  if (bVar1) {
    Containers::BasicStringView<const_char>::slice
              ((BasicStringView<const_char> *)&stack0xffffffffffffff88,0,
               ((ulong)in_RSI & 0x3fffffffffffffff) - 1);
    path_00._sizePlusFlags = (size_t)in_RDI;
    path_00._data = (char *)0x157abf;
    bVar1 = make(path_00);
    return bVar1;
  }
  path_02._sizePlusFlags = (size_t)in_RSI;
  path_02._data = (char *)in_RDI;
  split(path_02);
  filename._sizePlusFlags._0_1_ = local_68.super_Debug._flags._value;
  filename._sizePlusFlags._1_1_ = local_68.super_Debug._immediateFlags._value;
  filename._sizePlusFlags._2_1_ = local_68.super_Debug._internalFlags._value;
  filename._sizePlusFlags._3_1_ = local_68.super_Debug._previousColor;
  filename._sizePlusFlags._4_4_ = local_68.super_Debug._sourceLocationLine;
  filename._data = (char *)local_68.super_Debug._output;
  a._sizePlusFlags._0_1_ = local_68.super_Debug._flags._value;
  a._sizePlusFlags._1_1_ = local_68.super_Debug._immediateFlags._value;
  a._sizePlusFlags._2_1_ = local_68.super_Debug._internalFlags._value;
  a._sizePlusFlags._3_1_ = local_68.super_Debug._previousColor;
  a._sizePlusFlags._4_4_ = local_68.super_Debug._sourceLocationLine;
  a._data = (char *)local_68.super_Debug._output;
  bVar1 = (local_68.super_Debug._8_8_ & 0x3fffffffffffffff) != 0;
  sVar6 = CONCAT71(uVar7,bVar1 && local_68.super_Debug._output != (ostream *)0x0);
  if (bVar1 && local_68.super_Debug._output != (ostream *)0x0) {
    b._sizePlusFlags = 0xc000000000000001;
    b._data = "/";
    sVar6 = 0xc000000000000001;
    bVar1 = Containers::operator!=(a,b);
    if (((bVar1) && (bVar1 = exists(filename), !bVar1)) &&
       (path_01._sizePlusFlags = (size_t)in_RDI, path_01._data = (char *)0x157b30,
       bVar1 = make(path_01), !bVar1)) {
      return false;
    }
  }
  view._sizePlusFlags = sVar6;
  view._data = in_RSI;
  Containers::String::nullTerminatedView(&local_40,in_RDI,view);
  __path = Containers::String::data(&local_40);
  iVar3 = mkdir(__path,0x1ff);
  bVar1 = true;
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x11) {
      Containers::BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_28,&local_40);
      bVar2 = isDirectory(local_28);
      if (bVar2) goto LAB_00157c39;
      Error::Error(&local_68,(Flags)0x0);
      pDVar5 = Debug::operator<<(&local_68.super_Debug,"Utility::Path::make():");
      value._sizePlusFlags = (size_t)in_RSI;
      value._data = (char *)in_RDI;
      pDVar5 = Debug::operator<<(pDVar5,value);
      Debug::operator<<(pDVar5,"exists but is not a directory");
    }
    else {
      Error::Error(&local_68,(Flags)0x0);
      pDVar5 = Debug::operator<<(&local_68.super_Debug,"Utility::Path::make(): can\'t create");
      value_00._sizePlusFlags = (size_t)in_RSI;
      value_00._data = (char *)in_RDI;
      pDVar5 = Debug::operator<<(pDVar5,value_00);
      (pDVar5->_immediateFlags)._value = (pDVar5->_immediateFlags)._value | 4;
      Debug::operator<<(pDVar5,":");
      Implementation::printErrnoErrorString(&local_68.super_Debug,*piVar4);
    }
    Error::~Error(&local_68);
    bVar1 = false;
  }
LAB_00157c39:
  Containers::String::~String(&local_40);
  return bVar1;
}

Assistant:

bool make(const Containers::StringView path) {
    if(!path) return true;

    /* If the path contains trailing slash, strip it */
    if(path.hasSuffix('/'))
        return make(path.exceptSuffix(1));

    /* If parent directory doesn't exist, create it. That means two syscalls to
       create each parent (and two null-terminated string allocations on Unix /
       two UTF-16 conversions on Windows). I could also directly call into
       make() without checking exists() first, relying on mkdir() failing with
       EEXIST instead -- while that would save one syscall per path component
       that doesn't exist, for long paths that already exist (which is
       supposedly the more common scenario) it would mean mkdir() gets called
       once for each component instead of just one existence check for the
       parent and one mkdir() for the leaf directory. */
    const Containers::StringView parentPath = split(path).first();
    /* Can't use !isDirectory(parentPath) as it's not reliable on all platforms
       and could make the function fail even before attempting to create
       anything. With exists() the error message is slightly shittier if the
       parentPath is a file, but at least it doesn't fail. See the other use of
       isDirectory() below for more details. */
    if(parentPath && parentPath != "/"_s && !exists(parentPath) && !make(parentPath))
        return false;

    /* Create the leaf directory, return true if successfully created */
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN) || (defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT))
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    const Containers::String pathNullTerminated = Containers::String::nullTerminatedView(path);
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    const Containers::Array<wchar_t> pathWide = Unicode::widen(path);
    #else
    #error
    #endif
    if(
        /* Unix, Emscripten */
        #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
        mkdir(pathNullTerminated.data(), 0777) == 0
        /* Windows (not Store/Phone) */
        #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        CreateDirectoryW(pathWide.data(), nullptr) != 0
        #else
        #error
        #endif
    )
        return true;

    /* If already exists, return false if it's not a directory */
    if(
        /* Unix, Emscripten */
        #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
        errno == EEXIST
        /* Windows (not Store/Phone) */
        #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        GetLastError() == ERROR_ALREADY_EXISTS
        #else
        #error
        #endif
    ) {
        /* isDirectory() is known to work correctly only on Unix and
           Emscripten, not on iOS, and on Windows only partially, see the
           comments in the implementation above. The main goal is to have
           Path::make() work correctly in the happy cases, i.e. have it create
           the path if at all possible, and return true. In comparison, having
           it return `false` if the path exists but is a file, is only a
           nice-to-have behavior for rare scenarios. So skipping this extra
           check on platforms that can't detect a directory properly (and thus
           silently returning true even if the existing path may not be a
           directory) is not that of a big deal compared to failing always. */
        #if (defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)) || ((defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)) && !defined(CORRADE_TARGET_IOS))
        #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        const DWORD fileAttributes = GetFileAttributesW(pathWide);
        #endif
        if(
            /* On iOS (Simulator at least) stat() is a no-op, returning random
               values, thus isDirectory() returns false for it */
            #if (defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)) && !defined(CORRADE_TARGET_IOS)
            !isDirectory(pathNullTerminated)
            /* On Windows isDirectory() doesn't treat symlinks properly yet,
               as a workaround we treat symlinks as "may be a directory as
               well" to not have a failure in case the path exists and is a
               symlink to a directory. Furthermore, INVALID_FILE_ATTRIBUTES
               contain the FILE_ATTRIBUTE_DIRECTORY bit for some reason -- so
               if it wouldn't check for INVALID_FILE_ATTRIBUTES first, files
               that fail to query would still be treated as "fine, it's a
               directory". */
            #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
            fileAttributes != INVALID_FILE_ATTRIBUTES &&
                /* No idea what a "directory reparse point" is, but
                    https://learn.microsoft.com/en-us/windows/win32/fileio/file-attribute-constants
                   says it's set for symlinks as well */
                !(fileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) &&
                !(fileAttributes & FILE_ATTRIBUTE_DIRECTORY)
            #else
            #error
            #endif
        ) {
            Error{} << "Utility::Path::make():" << path << "exists but is not a directory";
            return false;
        }
        #endif

        return true;
    }

    Error err;
    err << "Utility::Path::make(): can't create" << path << Debug::nospace << ":";
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    Utility::Implementation::printErrnoErrorString(err, errno);
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    Utility::Implementation::printWindowsErrorString(err, GetLastError());
    #else
    #error
    #endif
    return false;
    #else
    Error{} << "Utility::Path::make(): not implemented on this platform";
    return false;
    #endif
}